

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O0

CURLcode protocol2num(char *str,curl_prot_t *val)

{
  int iVar1;
  char *pcVar2;
  Curl_handler *pCVar3;
  size_t local_40;
  Curl_handler *h;
  size_t tlen;
  char *token;
  curl_prot_t *val_local;
  char *str_local;
  
  *val = 0;
  if (str == (char *)0x0) {
    str_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    iVar1 = curl_strequal(str,"all");
    val_local = (curl_prot_t *)str;
    if (iVar1 == 0) {
      while( true ) {
        pcVar2 = strchr((char *)val_local,0x2c);
        if (pcVar2 == (char *)0x0) {
          local_40 = strlen((char *)val_local);
        }
        else {
          local_40 = (long)pcVar2 - (long)val_local;
        }
        if (local_40 != 0) {
          pCVar3 = Curl_getn_scheme_handler((char *)val_local,local_40);
          if (pCVar3 == (Curl_handler *)0x0) {
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          *val = pCVar3->protocol | *val;
        }
        if (pcVar2 == (char *)0x0) break;
        val_local = (curl_prot_t *)(pcVar2 + 1);
      }
      if (*val == 0) {
        str_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
      }
      else {
        str_local._4_4_ = CURLE_OK;
      }
    }
    else {
      *val = 0xffffffff;
      str_local._4_4_ = CURLE_OK;
    }
  }
  return str_local._4_4_;
}

Assistant:

static CURLcode protocol2num(const char *str, curl_prot_t *val)
{
  /*
   * We are asked to cherry-pick protocols, so play it safe and disallow all
   * protocols to start with, and re-add the wanted ones back in.
   */
  *val = 0;

  if(!str)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(curl_strequal(str, "all")) {
    *val = ~(curl_prot_t) 0;
    return CURLE_OK;
  }

  do {
    const char *token = str;
    size_t tlen;

    str = strchr(str, ',');
    tlen = str? (size_t) (str - token): strlen(token);
    if(tlen) {
      const struct Curl_handler *h = Curl_getn_scheme_handler(token, tlen);

      if(!h)
        return CURLE_UNSUPPORTED_PROTOCOL;

      *val |= h->protocol;
    }
  } while(str && str++);

  if(!*val)
    /* no protocol listed */
    return CURLE_BAD_FUNCTION_ARGUMENT;
  return CURLE_OK;
}